

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void boost::unordered::detail::foa::
     table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
     ::delete_(undefined8 param_1,long param_2)

{
  value_type *pvVar1;
  pointer __p;
  allocator_type sal;
  allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>
  *in_stack_ffffffffffffffd8;
  size_type __n;
  allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>
  *in_stack_ffffffffffffffe0;
  allocator_type *in_stack_ffffffffffffffe8;
  
  std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>::
  allocator(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pvVar1 = elements((table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                     *)0x61cfc8);
  if (pvVar1 != (value_type *)0x0) {
    __n = *(size_type *)(param_2 + 0x18);
    __p = (pointer)buffer_size(*(long *)(param_2 + 8) + 1);
    std::
    allocator_traits<std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
    ::deallocate(in_stack_ffffffffffffffe8,__p,__n);
  }
  return;
}

Assistant:

static void delete_(allocator_type al, table_arrays& arrays) noexcept {
        using storage_traits = std::allocator_traits<allocator_type>;

        auto sal = allocator_type(al);
        if (arrays.elements()) {
            storage_traits::deallocate(sal, arrays.elements_,
                                       buffer_size(arrays.groups_size_mask + 1));
        }
    }